

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynConstantSet * ParseConstantSet(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynConstant> constants;
  bool bVar1;
  Lexeme *pLVar2;
  SynConstant *pSVar3;
  Lexeme *pLVar4;
  SynIdentifier *pSVar5;
  SynError *pSVar6;
  InplaceStr local_b0;
  char *local_a0;
  char *local_98;
  undefined1 local_90 [8];
  InplaceStr name_1;
  SynBase *value;
  char *local_68;
  char *local_60;
  undefined1 local_58 [8];
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  Lexeme *pos;
  IntrusiveList<SynConstant> constantSet;
  SynBase *type;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_const);
  if (bVar1) {
    constantSet.tail = (SynConstant *)ParseType(ctx,(bool *)0x0,false);
    if (constantSet.tail == (SynConstant *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: type name expected after const");
      pSVar3 = (SynConstant *)ParseContext::get<SynError>(ctx);
      pLVar2 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)pSVar3,pLVar2,pLVar4);
      constantSet.tail = pSVar3;
    }
    IntrusiveList<SynConstant>::IntrusiveList((IntrusiveList<SynConstant> *)&pos);
    nameIdentifier = (SynIdentifier *)ctx->currentLexeme;
    name.end = (char *)0x0;
    bVar1 = anon_unknown.dwarf_104b6::CheckAt
                      (ctx,lex_string,"ERROR: constant name expected after type");
    if (bVar1) {
      _local_58 = ParseContext::Consume(ctx);
      pSVar5 = ParseContext::get<SynIdentifier>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      local_68 = (char *)local_58;
      local_60 = name.begin;
      SynIdentifier::SynIdentifier(pSVar5,pLVar2,pLVar4,_local_58);
      name.end = (char *)pSVar5;
    }
    else {
      nameIdentifier = (SynIdentifier *)ParseContext::Previous(ctx);
      pSVar5 = ParseContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr((InplaceStr *)&value);
      SynIdentifier::SynIdentifier(pSVar5,_value);
      name.end = (char *)pSVar5;
    }
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_set,"ERROR: \'=\' not found after constant name")
    ;
    name_1.end = (char *)ParseTernaryExpr(ctx);
    if ((SynBase *)name_1.end == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: expression not found after \'=\'");
      pSVar6 = ParseContext::get<SynError>(ctx);
      pLVar2 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError(pSVar6,pLVar2,pLVar4);
      name_1.end = (char *)pSVar6;
    }
    pSVar3 = ParseContext::get<SynConstant>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynConstant::SynConstant
              (pSVar3,(Lexeme *)nameIdentifier,pLVar2,(SynIdentifier *)name.end,
               (SynBase *)name_1.end);
    IntrusiveList<SynConstant>::push_back((IntrusiveList<SynConstant> *)&pos,pSVar3);
    while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
      nameIdentifier = (SynIdentifier *)ctx->currentLexeme;
      bVar1 = anon_unknown.dwarf_104b6::CheckAt
                        (ctx,lex_string,"ERROR: constant name expected after \',\'");
      if (bVar1) {
        _local_90 = ParseContext::Consume(ctx);
        pSVar5 = ParseContext::get<SynIdentifier>(ctx);
        pLVar2 = ParseContext::Previous(ctx);
        pLVar4 = ParseContext::Previous(ctx);
        local_a0 = (char *)local_90;
        local_98 = name_1.begin;
        SynIdentifier::SynIdentifier(pSVar5,pLVar2,pLVar4,_local_90);
        name.end = (char *)pSVar5;
      }
      else {
        nameIdentifier = (SynIdentifier *)ParseContext::Previous(ctx);
        pSVar5 = ParseContext::get<SynIdentifier>(ctx);
        InplaceStr::InplaceStr(&local_b0);
        SynIdentifier::SynIdentifier(pSVar5,local_b0);
        name.end = (char *)pSVar5;
      }
      name_1.end = (char *)0x0;
      bVar1 = ParseContext::Consume(ctx,lex_set);
      if ((bVar1) &&
         (name_1.end = (char *)ParseTernaryExpr(ctx), (SynBase *)name_1.end == (SynBase *)0x0)) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: expression not found after \'=\'");
        pSVar6 = ParseContext::get<SynError>(ctx);
        pLVar2 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError(pSVar6,pLVar2,pLVar4);
        name_1.end = (char *)pSVar6;
      }
      pSVar3 = ParseContext::get<SynConstant>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynConstant::SynConstant
                (pSVar3,(Lexeme *)nameIdentifier,pLVar2,(SynIdentifier *)name.end,
                 (SynBase *)name_1.end);
      IntrusiveList<SynConstant>::push_back((IntrusiveList<SynConstant> *)&pos,pSVar3);
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after constants");
    ctx_local = (ParseContext *)ParseContext::get<SynConstantSet>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    constants.tail = constantSet.head;
    constants.head = (SynConstant *)pos;
    SynConstantSet::SynConstantSet
              ((SynConstantSet *)ctx_local,begin,pLVar2,&(constantSet.tail)->super_SynBase,constants
              );
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynConstantSet *)ctx_local;
}

Assistant:

SynConstantSet* ParseConstantSet(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_const))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: type name expected after const");

			type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		IntrusiveList<SynConstant> constantSet;

		Lexeme *pos = ctx.currentLexeme;

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: constant name expected after type"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			pos = ctx.Previous();

			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_set, "ERROR: '=' not found after constant name");

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));

		while(ctx.Consume(lex_comma))
		{
			pos = ctx.currentLexeme;

			if(CheckAt(ctx, lex_string, "ERROR: constant name expected after ','"))
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}

			constantSet.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after constants");

		return new (ctx.get<SynConstantSet>()) SynConstantSet(start, ctx.Previous(), type, constantSet);
	}

	return NULL;
}